

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_10f1ef::CpuImmediateTest_adc_carry_but_no_overflow_Test::
~CpuImmediateTest_adc_carry_but_no_overflow_Test
          (CpuImmediateTest_adc_carry_but_no_overflow_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuImmediateTest, adc_carry_but_no_overflow) {
    registers.a = 0xD0;
    registers.p = V_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x20;
    memory_content = 0x50;

    run_instruction(ADC_IMM);
}